

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.hpp
# Opt level: O0

void __thiscall
oqpi::
worker<oqpi::itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>,_oqpi::itfc::semaphore<oqpi::posix_semaphore,_oqpi::local_sync_object>,_oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::worker_base>_>
::start(worker<oqpi::itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>,_oqpi::itfc::semaphore<oqpi::posix_semaphore,_oqpi::local_sync_object>,_oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::worker_base>_>
        *this)

{
  type local_80;
  self_type local_78 [3];
  string local_60;
  undefined1 local_40 [8];
  thread_attributes threadAttributes;
  worker<oqpi::itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>,_oqpi::itfc::semaphore<oqpi::posix_semaphore,_oqpi::local_sync_object>,_oqpi::scheduler<concurrent_queue>,_oqpi::context_container<oqpi::worker_base>_>
  *this_local;
  
  threadAttributes._40_8_ = this;
  std::atomic<bool>::store(&this->running_,true,memory_order_seq_cst);
  thread_attributes::thread_attributes
            ((thread_attributes *)local_40,&(this->super_worker_base).config_.threadAttributes);
  if (-1 < (this->super_worker_base).id_) {
    std::__cxx11::to_string(&local_60,(this->super_worker_base).id_);
    std::__cxx11::string::operator+=((string *)local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  local_80.this = this;
  itfc::thread<oqpi::posix_thread,oqpi::empty_layer>::
  thread<oqpi::worker<oqpi::itfc::thread<oqpi::posix_thread,oqpi::empty_layer>,oqpi::itfc::semaphore<oqpi::posix_semaphore,oqpi::local_sync_object>,oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::worker_base>>::start()::_lambda()_1_>
            ((thread<oqpi::posix_thread,oqpi::empty_layer> *)local_78,(thread_attributes *)local_40,
             &local_80);
  itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>::operator=(&this->thread_,local_78);
  itfc::thread<oqpi::posix_thread,_oqpi::empty_layer>::~thread(local_78);
  thread_attributes::~thread_attributes((thread_attributes *)local_40);
  return;
}

Assistant:

virtual void start() override final
        {
            // Important to set the worker as running before starting the thread
            running_.store(true);

            // Add the id to the worker name so we can differentiate them when several workers
            // share the same config (and thus the same name)
            auto threadAttributes = worker_base::config_.threadAttributes;
            if (id_ >= 0)
            {
                threadAttributes.name_ += std::to_string(id_);
            }

            // Start the thread, running_ must be set to true beforehand
            thread_ = _Thread(threadAttributes, [this]() { run(); });
        }